

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index shift)

{
  Index IVar1;
  Index index;
  pointer this_00;
  pointer pBVar2;
  pointer this_01;
  pointer pBVar3;
  LocalGet *left;
  LocalGet *right;
  Binary *value;
  LocalSet *any;
  Const *append;
  Block *pBVar4;
  Type local_30;
  Type local_28;
  Index local_1c;
  Index local_18;
  Index shift_local;
  Index leftLow_local;
  Index highBits_local;
  I64ToI32Lowering *this_local;
  
  local_1c = shift;
  local_18 = leftLow;
  shift_local = highBits;
  _leftLow_local = this;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  index = shift_local;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_18;
  wasm::Type::Type(&local_28,i32);
  left = Builder::makeLocalGet(pBVar3,IVar1,local_28);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = local_1c;
  wasm::Type::Type(&local_30,i32);
  right = Builder::makeLocalGet(pBVar3,IVar1,local_30);
  value = Builder::makeBinary(this_01,ShlInt32,(Expression *)left,(Expression *)right);
  any = Builder::makeLocalSet(pBVar2,index,(Expression *)value);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  append = Builder::makeConst<int>(pBVar2,0);
  pBVar4 = Builder::blockify(this_00,(Expression *)any,(Expression *)append);
  return pBVar4;
}

Assistant:

Block* makeLargeShl(Index highBits, Index leftLow, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(
        highBits,
        builder->makeBinary(ShlInt32,
                            builder->makeLocalGet(leftLow, Type::i32),
                            builder->makeLocalGet(shift, Type::i32))),
      builder->makeConst(int32_t(0)));
  }